

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_paged_audio_buffer_get_cursor_in_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,ma_uint64 *pCursor)

{
  ma_uint64 *pCursor_local;
  ma_paged_audio_buffer *pPagedAudioBuffer_local;
  
  if (pCursor == (ma_uint64 *)0x0) {
    pPagedAudioBuffer_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pCursor = 0;
    if (pPagedAudioBuffer == (ma_paged_audio_buffer *)0x0) {
      pPagedAudioBuffer_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      *pCursor = pPagedAudioBuffer->absoluteCursor;
      pPagedAudioBuffer_local._4_4_ = MA_SUCCESS;
    }
  }
  return pPagedAudioBuffer_local._4_4_;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_get_cursor_in_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;   /* Safety. */

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = pPagedAudioBuffer->absoluteCursor;

    return MA_SUCCESS;
}